

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O1

int Gia_ManTerRetire2(Gia_ManTer_t *p,uint *pState)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Gia_Man_t *pGVar4;
  uint *puVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  
  uVar8 = (ulong)p->pAig->nRegs;
  iVar7 = -1;
  if (0 < (long)uVar8) {
    bVar10 = 0;
    uVar11 = 0;
    do {
      if (((~(pState[uVar11 >> 4 & 0xfffffff] >> (bVar10 & 0x1e)) & 3) != 0) &&
         (p->pRetired[uVar11] == '\0')) {
        if (iVar7 <= p->pCountX[uVar11]) {
          iVar7 = p->pCountX[uVar11];
        }
      }
      uVar11 = uVar11 + 1;
      bVar10 = bVar10 + 2;
    } while (uVar8 != uVar11);
  }
  if (iVar7 < 0) {
    __assert_fail("iMaxTerValue >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                  ,0x1a6,"int Gia_ManTerRetire2(Gia_ManTer_t *, unsigned int *)");
  }
  if (0 < p->pAig->nRegs) {
    bVar10 = 0;
    uVar8 = 0;
    do {
      if ((((~(pState[uVar8 >> 4 & 0xfffffff] >> (bVar10 & 0x1e)) & 3) != 0) &&
          (p->pRetired[uVar8] == '\0')) && (iVar7 == p->pCountX[uVar8])) {
        p->pRetired[uVar8] = '\x01';
        Vec_IntPush(p->vRetired,(int)uVar8);
        if (iVar7 == 0) break;
      }
      uVar8 = uVar8 + 1;
      bVar10 = bVar10 + 2;
    } while ((long)uVar8 < (long)p->pAig->nRegs);
  }
  pVVar2 = p->vRetired;
  iVar7 = pVVar2->nSize;
  if (0 < iVar7) {
    piVar3 = pVVar2->pArray;
    pGVar4 = p->pAig;
    puVar5 = p->pDataSimCis;
    pVVar6 = pGVar4->vCis;
    lVar12 = 0;
    do {
      iVar9 = (pVVar6->nSize - pGVar4->nRegs) + piVar3[lVar12];
      iVar7 = iVar9 >> 4;
      uVar1 = puVar5[iVar7];
      bVar10 = (char)iVar9 * '\x02';
      puVar5[iVar7] = (~(uVar1 >> (bVar10 & 0x1f)) & 3) << (bVar10 & 0x1f) ^ uVar1;
      lVar12 = lVar12 + 1;
      iVar7 = pVVar2->nSize;
    } while (lVar12 < iVar7);
  }
  return iVar7;
}

Assistant:

int Gia_ManTerRetire2( Gia_ManTer_t * p, unsigned * pState )
{
    int i, Entry, iMaxTerValue = -1;
    // find non-retired register with this value
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pState, i ) != GIA_UND && !p->pRetired[i] && iMaxTerValue < p->pCountX[i] )
            iMaxTerValue = p->pCountX[i];
    assert( iMaxTerValue >= 0 );
    // retire the first registers with this value
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pState, i ) != GIA_UND && !p->pRetired[i] && iMaxTerValue == p->pCountX[i] )
        {
            assert( p->pRetired[i] == 0 );
            p->pRetired[i] = 1;
            Vec_IntPush( p->vRetired, i );
            if ( iMaxTerValue == 0 )
                break;
        }
    // update all the retired registers
    Vec_IntForEachEntry( p->vRetired, Entry, i )
        Gia_ManTerSimInfoSet( p->pDataSimCis, Gia_ManPiNum(p->pAig)+Entry, GIA_UND );
    return Vec_IntSize(p->vRetired);
}